

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_cipher.cc
# Opt level: O1

EVP_CIPHER * EVP_get_cipherbyname(char *name)

{
  int iVar1;
  long lVar2;
  EVP_CIPHER *pEVar3;
  char *b;
  
  if (name != (char *)0x0) {
    iVar1 = OPENSSL_strcasecmp(name,"3des");
    b = "des-ede3-cbc";
    if (iVar1 != 0) {
      b = name;
    }
    lVar2 = 0x10;
    do {
      iVar1 = OPENSSL_strcasecmp(*(char **)(&UNK_002655d8 + lVar2),b);
      if (iVar1 == 0) {
        pEVar3 = (EVP_CIPHER *)(**(code **)((long)&kCiphers[0].nid + lVar2))();
        return pEVar3;
      }
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x220);
  }
  return (EVP_CIPHER *)0x0;
}

Assistant:

const EVP_CIPHER *EVP_get_cipherbyname(const char *name) {
  if (name == NULL) {
    return NULL;
  }

  // This is not a name used by OpenSSL, but tcpdump registers it with
  // |EVP_add_cipher_alias|. Our |EVP_add_cipher_alias| is a no-op, so we
  // support the name here.
  if (OPENSSL_strcasecmp(name, "3des") == 0) {
    name = "des-ede3-cbc";
  }

  for (size_t i = 0; i < OPENSSL_ARRAY_SIZE(kCiphers); i++) {
    if (OPENSSL_strcasecmp(kCiphers[i].name, name) == 0) {
      return kCiphers[i].func();
    }
  }

  return NULL;
}